

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,xmlRegAtomPtr atom,
                        xmlRegStatePtr target,int counter,int count)

{
  xmlRegTrans *pxVar1;
  xmlRegTrans *tmp;
  xmlRegTransPtr trans;
  int nrtrans;
  int count_local;
  int counter_local;
  xmlRegStatePtr target_local;
  xmlRegAtomPtr atom_local;
  xmlRegStatePtr state_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (state == (xmlRegStatePtr)0x0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"add state: state is NULL");
  }
  else if (target == (xmlRegStatePtr)0x0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"add state: target is NULL");
  }
  else {
    trans._4_4_ = state->nbTrans;
    do {
      trans._4_4_ = trans._4_4_ + -1;
      if (trans._4_4_ < 0) {
        if (state->maxTrans == 0) {
          state->maxTrans = 8;
          pxVar1 = (xmlRegTrans *)(*xmlMalloc)((long)state->maxTrans * 0x18);
          state->trans = pxVar1;
          if (state->trans == (xmlRegTrans *)0x0) {
            xmlRegexpErrMemory(ctxt,"adding transition");
            state->maxTrans = 0;
            return;
          }
        }
        else if (state->maxTrans <= state->nbTrans) {
          state->maxTrans = state->maxTrans << 1;
          pxVar1 = (xmlRegTrans *)(*xmlRealloc)(state->trans,(long)state->maxTrans * 0x18);
          if (pxVar1 == (xmlRegTrans *)0x0) {
            xmlRegexpErrMemory(ctxt,"adding transition");
            state->maxTrans = state->maxTrans / 2;
            return;
          }
          state->trans = pxVar1;
        }
        state->trans[state->nbTrans].atom = atom;
        state->trans[state->nbTrans].to = target->no;
        state->trans[state->nbTrans].counter = counter;
        state->trans[state->nbTrans].count = count;
        state->trans[state->nbTrans].nd = 0;
        state->nbTrans = state->nbTrans + 1;
        xmlRegStateAddTransTo(ctxt,target,state->no);
        return;
      }
      pxVar1 = state->trans + trans._4_4_;
    } while ((((pxVar1->atom != atom) || (pxVar1->to != target->no)) || (pxVar1->counter != counter)
             ) || (pxVar1->count != count));
  }
  return;
}

Assistant:

static void
xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	            xmlRegAtomPtr atom, xmlRegStatePtr target,
		    int counter, int count) {

    int nrtrans;

    if (state == NULL) {
	ERROR("add state: state is NULL");
	return;
    }
    if (target == NULL) {
	ERROR("add state: target is NULL");
	return;
    }
    /*
     * Other routines follow the philosophy 'When in doubt, add a transition'
     * so we check here whether such a transition is already present and, if
     * so, silently ignore this request.
     */

    for (nrtrans = state->nbTrans - 1; nrtrans >= 0; nrtrans--) {
	xmlRegTransPtr trans = &(state->trans[nrtrans]);
	if ((trans->atom == atom) &&
	    (trans->to == target->no) &&
	    (trans->counter == counter) &&
	    (trans->count == count)) {
#ifdef DEBUG_REGEXP_GRAPH
	    printf("Ignoring duplicate transition from %d to %d\n",
		    state->no, target->no);
#endif
	    return;
	}
    }

    if (state->maxTrans == 0) {
	state->maxTrans = 8;
	state->trans = (xmlRegTrans *) xmlMalloc(state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (state->trans == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans = 0;
	    return;
	}
    } else if (state->nbTrans >= state->maxTrans) {
	xmlRegTrans *tmp;
	state->maxTrans *= 2;
	tmp = (xmlRegTrans *) xmlRealloc(state->trans, state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans /= 2;
	    return;
	}
	state->trans = tmp;
    }
#ifdef DEBUG_REGEXP_GRAPH
    printf("Add trans from %d to %d ", state->no, target->no);
    if (count == REGEXP_ALL_COUNTER)
	printf("all transition\n");
    else if (count >= 0)
	printf("count based %d\n", count);
    else if (counter >= 0)
	printf("counted %d\n", counter);
    else if (atom == NULL)
	printf("epsilon transition\n");
    else if (atom != NULL)
        xmlRegPrintAtom(stdout, atom);
#endif

    state->trans[state->nbTrans].atom = atom;
    state->trans[state->nbTrans].to = target->no;
    state->trans[state->nbTrans].counter = counter;
    state->trans[state->nbTrans].count = count;
    state->trans[state->nbTrans].nd = 0;
    state->nbTrans++;
    xmlRegStateAddTransTo(ctxt, target, state->no);
}